

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O2

int strcmp(char *__s1,char *__s2)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    bVar1 = __s1[lVar2];
    if ((bVar1 == 0) || (bVar1 != __s2[lVar2])) break;
    lVar2 = lVar2 + 1;
  }
  return (uint)bVar1 - (uint)(byte)__s2[lVar2];
}

Assistant:

int strcmp( const char * s1, const char * s2 )
{
    while ( ( *s1 ) && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
    }

    return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
}